

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int stats_mutexes_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  duckdb_je_malloc_mutex_prof_data_reset((tsdn_t *)tsd,&ctl_mtx);
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_lock);
  duckdb_je_malloc_mutex_prof_data_reset((tsdn_t *)tsd,&duckdb_je_background_thread_lock);
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  uVar3 = duckdb_je_narenas_total_get();
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    pvVar1 = duckdb_je_arenas[uVar4].repr;
    if (pvVar1 != (void *)0x0) {
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x2938));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x2938));
      *(undefined1 *)((long)pvVar1 + 0x2978) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x2980));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x133c8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x133c8));
      *(undefined1 *)((long)pvVar1 + 0x13408) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x13410));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x29f8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x29f8));
      *(undefined1 *)((long)pvVar1 + 0x2a38) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x2a40));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x75e8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x75e8));
      *(undefined1 *)((long)pvVar1 + 0x7628) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x7630));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0xc1d8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0xc1d8));
      *(undefined1 *)((long)pvVar1 + 0xc218) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0xc220));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x10ed8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x10ed8));
      *(undefined1 *)((long)pvVar1 + 0x10f18) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x10f20));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x115d0));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x115d0));
      *(undefined1 *)((long)pvVar1 + 0x11610) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x11618));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x28b8));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar1 + 0x28b8));
      *(undefined1 *)((long)pvVar1 + 0x28f8) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x2900));
      malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar1 + 0x13470) + 0x20));
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar1 + 0x13470) + 0x20));
      lVar2 = *(long *)((long)pvVar1 + 0x13470);
      *(undefined1 *)(lVar2 + 0x60) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x68));
      for (uVar5 = 0; uVar5 != 0x24; uVar5 = uVar5 + 1) {
        pvVar7 = pvVar1;
        pvVar10 = pvVar1;
        for (uVar6 = 0; uVar6 < duckdb_je_bin_infos[uVar5].n_shards; uVar6 = uVar6 + 1) {
          uVar8 = (ulong)duckdb_je_arena_bin_offsets[uVar5];
          pvVar9 = pvVar10;
          if (uVar5 < duckdb_je_bin_info_nbatched_sizes) {
            pvVar9 = pvVar7;
          }
          malloc_mutex_lock((tsdn_t *)tsd,(malloc_mutex_t *)(uVar8 + (long)pvVar9));
          duckdb_je_malloc_mutex_prof_data_reset
                    ((tsdn_t *)tsd,(malloc_mutex_t *)(uVar8 + (long)pvVar9));
          *(undefined1 *)((long)pvVar9 + uVar8 + 0x40) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar9 + uVar8 + 0x48));
          pvVar7 = (void *)((long)pvVar7 + 0x288);
          pvVar10 = (void *)((long)pvVar10 + 0x100);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
stats_mutexes_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}

	tsdn_t *tsdn = tsd_tsdn(tsd);

#define MUTEX_PROF_RESET(mtx)						\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_data_reset(tsdn, &mtx);				\
    malloc_mutex_unlock(tsdn, &mtx);

	/* Global mutexes: ctl and prof. */
	MUTEX_PROF_RESET(ctl_mtx);
	if (have_background_thread) {
		MUTEX_PROF_RESET(background_thread_lock);
	}
	if (config_prof && opt_prof) {
		MUTEX_PROF_RESET(bt2gctx_mtx);
		MUTEX_PROF_RESET(tdatas_mtx);
		MUTEX_PROF_RESET(prof_dump_mtx);
		MUTEX_PROF_RESET(prof_recent_alloc_mtx);
		MUTEX_PROF_RESET(prof_recent_dump_mtx);
		MUTEX_PROF_RESET(prof_stats_mtx);
	}

	/* Per arena mutexes. */
	unsigned n = narenas_total_get();

	for (unsigned i = 0; i < n; i++) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		MUTEX_PROF_RESET(arena->large_mtx);
		MUTEX_PROF_RESET(arena->pa_shard.edata_cache.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_muzzy.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_retained.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_muzzy.mtx);
		MUTEX_PROF_RESET(arena->tcache_ql_mtx);
		MUTEX_PROF_RESET(arena->base->mtx);

		for (szind_t j = 0; j < SC_NBINS; j++) {
			for (unsigned k = 0; k < bin_infos[j].n_shards; k++) {
				bin_t *bin = arena_get_bin(arena, j, k);
				MUTEX_PROF_RESET(bin->lock);
			}
		}
	}
#undef MUTEX_PROF_RESET
	return 0;
}